

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::format_uint<3u,char,fmt::v7::detail::buffer_appender<char>,unsigned__int128>
          (buffer_appender<char> out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  type tVar1;
  char *buffer_00;
  int in_ECX;
  undefined4 in_register_00000034;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  char local_98 [8];
  char buffer [43];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  buffer_appender<char> out_local;
  
  tVar1 = to_unsigned<int>(in_ECX);
  buffer_00 = to_pointer<char>(out,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    value_01._8_8_ = in_stack_ffffffffffffff50;
    value_01._0_8_ = in_stack_ffffffffffffff48;
    format_uint<3u,char,unsigned__int128>(local_98,(unsigned___int128)value_01,num_digits,upper);
    out_local = copy_str<char,_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                          (local_98,local_98 + in_ECX,out);
  }
  else {
    value_00._8_8_ = in_stack_ffffffffffffff50;
    value_00._0_8_ = in_stack_ffffffffffffff48;
    unique0x100000eb = CONCAT44(in_register_00000034,num_digits);
    format_uint<3u,char,unsigned__int128>(buffer_00,(unsigned___int128)value_00,num_digits,upper);
    out_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  return (buffer_appender<char>)
         out_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}